

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

Continue anon_unknown.dwarf_1940295::TryCompileLangProp
                   (Arguments *args,string_view key,string_view val)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  mapped_type *this_00;
  allocator<char> local_89;
  key_type local_88;
  allocator<char> local_51;
  string local_50 [32];
  Arguments *local_30;
  Arguments *args_local;
  string_view val_local;
  string_view key_local;
  
  val_local._M_len = (size_t)val._M_str;
  args_local = (Arguments *)val._M_len;
  val_local._M_str = (char *)key._M_len;
  local_30 = args;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_50,(basic_string_view<char,_std::char_traits<char>_> *)&args_local,&local_51);
  this = &local_30->LangProps;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_88,
             (basic_string_view<char,_std::char_traits<char>_> *)&val_local._M_str,&local_89);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this,&local_88);
  std::__cxx11::string::operator=((string *)this_00,local_50);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  return No;
}

Assistant:

ArgumentParser::Continue TryCompileLangProp(Arguments& args,
                                            cm::string_view key,
                                            cm::string_view val)
{
  args.LangProps[std::string(key)] = std::string(val);
  return ArgumentParser::Continue::No;
}